

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool pmu_counter_enabled(CPUARMState_conflict *env,uint8_t counter)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint64_t *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  uVar1 = env->features;
  if ((uVar1 & 0x200000000) == 0) {
    bVar12 = false;
  }
  else if (env->aarch64 == 0) {
    bVar12 = true;
    if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_00619177;
  }
  else {
    bVar12 = true;
    if ((~env->pstate & 0xc) != 0) {
LAB_00619177:
      bVar12 = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar9 = env->uncached_cpsr & 0x1f;
      if (uVar9 == 0x10) {
        uVar9 = 0;
      }
      else if (uVar9 == 0x16) {
LAB_00619228:
        uVar9 = 3;
      }
      else if (uVar9 == 0x1a) {
        uVar9 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          if (uVar9 == 0x16) {
            uVar9 = 3;
            if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061922e;
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_00619228;
        }
        uVar9 = 1;
      }
    }
    else {
      uVar9 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar9 = 1;
    if ((env->v7m).exception == 0) {
      uVar9 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061922e:
  if ((uVar1 >> 0x23 & 1) == 0) {
    bVar3 = 0;
    goto LAB_00619451;
  }
  uVar4 = (env->cp15).mdcr_el2;
  if (((uVar1 >> 0x20 & 1) == 0) || (counter == '\x1f' || counter < ((byte)uVar4 & 0x1f))) {
    if (((env->cp15).c9_pmcr & 1) == 0) goto LAB_00619290;
LAB_00619277:
    bVar11 = ((env->cp15).c9_pmcnten >> ((ulong)counter & 0x3f) & 1) != 0;
  }
  else {
    if ((char)(byte)uVar4 < '\0') goto LAB_00619277;
LAB_00619290:
    bVar11 = false;
  }
  if (bVar12 == false) {
    if (uVar9 != 2) goto LAB_006192ef;
    if ((counter == '\x1f') || ((uint)counter < ((uint)uVar4 & 7))) goto LAB_006192a3;
LAB_00619306:
    bVar3 = 0;
    puVar7 = (env->cp15).c14_pmevtyper + counter;
    bVar2 = false;
  }
  else {
    if ((uVar1 & 0x200000000) == 0) {
LAB_006192ef:
      bVar3 = 0;
      if (counter != '\x1f') goto LAB_00619306;
    }
    else {
      uVar4 = (env->cp15).mdcr_el3;
LAB_006192a3:
      bVar3 = (byte)(uVar4 >> 0x11);
      if (counter == '\x1f' && (~bVar3 & 1) == 0) {
        bVar3 = (byte)(env->cp15).c9_pmcr >> 5;
      }
      else if (counter != '\x1f') {
        bVar2 = false;
        puVar7 = (env->cp15).c14_pmevtyper + counter;
        goto LAB_0061931d;
      }
    }
    puVar7 = &(env->cp15).pmccfiltr_el0;
    bVar2 = true;
  }
LAB_0061931d:
  uVar4 = *puVar7;
  bVar13 = (uVar1 & 0x200000000) != 0;
  uVar10 = uVar1 >> 0x1c & 0xffffffff;
  if (bVar13) {
    uVar10 = 0;
  }
  uVar6 = (uint)uVar4;
  if ((~uVar1 & 0x210000000) == 0) {
    uVar10 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
  }
  if (((uVar1 >> 0x20 & 1) == 0) ||
     (((uVar1 & 0x200000000) != 0 && (((env->cp15).scr_el3 & 1) == 0)))) {
LAB_00619385:
    uVar8 = 0;
    if (((uVar1 & 0x200000000) != 0) && ((uVar10 & 1) != 0)) {
      uVar8 = (uint)(uVar4 >> 0x1a) & 1;
    }
  }
  else {
    uVar8 = 0;
    if ((uVar10 & 1) != 0) {
      uVar10 = (env->cp15).hcr_el2 >> 0x1f;
      goto LAB_00619385;
    }
  }
  if (uVar9 == 2) {
    bVar5 = (uVar1 >> 0x20 & 1) == 0 || (uVar6 >> 0x1b & 1) == 0;
  }
  else if (uVar9 == 1) {
    bVar5 = (bool)(~bVar12 & (uVar1 & 0x200000000) != 0 & (byte)(uVar4 >> 0x1d) & 1 ^ (int)uVar6 < 0
                  );
  }
  else if (uVar9 == 0) {
    bVar5 = (uVar4 & 0x40000000) != 0;
    if (bVar12 == false) {
      bVar5 = (uVar6 & 0x40000000) >> 0x1e != (uint)(bVar13 & (byte)(uVar4 >> 0x1c) & 1);
    }
  }
  else {
    bVar5 = uVar8 != ((uint)(uVar4 >> 0x1f) & 1);
  }
  if (bVar2) {
joined_r0x0061943c:
    if (bVar11) {
      bVar3 = (bVar3 | bVar5) ^ 1;
      goto LAB_00619451;
    }
  }
  else if ((ushort)uVar4 < 0x3d) {
    bVar11 = (bool)(supported_event_map[uVar6 & 0x3f] != 0xffff & bVar11);
    goto joined_r0x0061943c;
  }
  bVar3 = 0;
LAB_00619451:
  return (_Bool)(bVar3 & 1);
}

Assistant:

static bool pmu_counter_enabled(CPUARMState *env, uint8_t counter)
{
    uint64_t filter;
    bool e, p, u, nsk, nsu, nsh, m;
    bool enabled, prohibited, filtered;
    bool secure = arm_is_secure(env);
    int el = arm_current_el(env);
    uint8_t hpmn = env->cp15.mdcr_el2 & MDCR_HPMN;

    if (!arm_feature(env, ARM_FEATURE_PMU)) {
        return false;
    }

    if (!arm_feature(env, ARM_FEATURE_EL2) ||
            (counter < hpmn || counter == 31)) {
        e = env->cp15.c9_pmcr & PMCRE;
    } else {
        e = env->cp15.mdcr_el2 & MDCR_HPME;
    }
    enabled = e && (env->cp15.c9_pmcnten & (1ULL << counter));

    if (!secure) {
        if (el == 2 && (counter < (hpmn & 0x7) || counter == 31)) {
            prohibited = env->cp15.mdcr_el2 & MDCR_HPMD;
        } else {
            prohibited = false;
        }
    } else {
        prohibited = arm_feature(env, ARM_FEATURE_EL3) &&
           (env->cp15.mdcr_el3 & MDCR_SPME);
    }

    if (prohibited && counter == 31) {
        prohibited = env->cp15.c9_pmcr & PMCRDP;
    }

    if (counter == 31) {
        filter = env->cp15.pmccfiltr_el0;
    } else {
        filter = env->cp15.c14_pmevtyper[counter];
    }

    p   = filter & PMXEVTYPER_P;
    u   = filter & PMXEVTYPER_U;
    nsk = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSK);
    nsu = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSU);
    nsh = arm_feature(env, ARM_FEATURE_EL2) && (filter & PMXEVTYPER_NSH);
    m   = arm_el_is_aa64(env, 1) &&
              arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_M);

    if (el == 0) {
        filtered = secure ? u : u != nsu;
    } else if (el == 1) {
        filtered = secure ? p : p != nsk;
    } else if (el == 2) {
        filtered = !nsh;
    } else { /* EL3 */
        filtered = m != p;
    }

    if (counter != 31) {
        /*
         * If not checking PMCCNTR, ensure the counter is setup to an event we
         * support
         */
        uint16_t event = filter & PMXEVTYPER_EVTCOUNT;
        if (!event_supported(event)) {
            return false;
        }
    }

    return enabled && !prohibited && !filtered;
}